

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O1

void __thiscall bandit::reporter::info::context_starting(info *this,string *desc)

{
  _Map_pointer ppcVar1;
  
  progress_base::context_starting((progress_base *)this,desc);
  std::
  deque<bandit::reporter::info::context_info,std::allocator<bandit::reporter::info::context_info>>::
  emplace_back<std::__cxx11::string_const&>
            ((deque<bandit::reporter::info::context_info,std::allocator<bandit::reporter::info::context_info>>
              *)&this->context_stack_,desc);
  ppcVar1 = (this->context_stack_).c.
            super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * -0x5555555555555555 +
      ((long)(this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
      (((long)ppcVar1 -
        (long)(this->context_stack_).c.
              super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
      (ulong)(ppcVar1 == (_Map_pointer)0x0)) * 10 == 1) {
    output_context_start_message(this);
    return;
  }
  this->not_yet_shown_ = this->not_yet_shown_ + 1;
  return;
}

Assistant:

void context_starting(const std::string& desc) override {
        progress_base::context_starting(desc);
        context_stack_.emplace(desc);
        if (context_stack_.size() == 1) {
          output_context_start_message();
        } else {
          ++not_yet_shown_;
        }
      }